

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O2

void __thiscall Hex::Hexdumper<unsigned_short>::dump(Hexdumper<unsigned_short> *this,ostream *os)

{
  uint uVar1;
  unsigned_short *puVar2;
  int iVar3;
  char filler;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  long lVar9;
  ostream *poVar10;
  long lVar11;
  unsigned_short *first;
  int unitsperline;
  unsigned_short *puVar12;
  pair<const_unsigned_short_*,_const_unsigned_short_*> curline;
  int local_58;
  pair<const_unsigned_short_*,_const_unsigned_short_*> local_48;
  
  filler = std::ios::fill();
  iVar6 = *(int *)(os + *(long *)(*(long *)os + -0x18) + 0x10);
  uVar1 = *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18);
  uVar5 = uVar1 & 0xb0;
  if ((uVar1 >> 10 & 1) != 0) {
    Hexdumper_base::getbaseofs(os);
  }
  uVar7 = Hexdumper_base::getstep(os);
  uVar8 = Hexdumper_base::getthreshold(os);
  iVar3 = 0x20;
  if ((uVar1 >> 0xb & 1) == 0) {
    iVar3 = 8;
  }
  unitsperline = 0x10;
  if (uVar5 != 0x20) {
    unitsperline = iVar3;
  }
  if (iVar6 != -1) {
    unitsperline = iVar6;
  }
  local_48.first = this->_first;
  lVar9 = *(long *)os;
  lVar11 = *(long *)(lVar9 + -0x18);
  *(uint *)(os + lVar11 + 0x18) = *(uint *)(os + lVar11 + 0x18) & 0xffffff4f | 0x80;
  *(undefined8 *)(os + *(long *)(lVar9 + -0x18) + 0x10) = 0;
  lVar9 = (long)unitsperline;
  first = local_48.first;
  local_48.second = local_48.first;
  do {
    puVar2 = this->_last;
    if (puVar2 <= first) {
      Hexdumper_base::clearflags(os);
      return;
    }
    puVar12 = first + lVar9;
    if (puVar2 <= puVar12) {
      puVar12 = this->_last;
    }
    if (unitsperline == 0) {
      puVar12 = puVar2;
    }
    curline.first = first;
    curline.second = puVar12;
    if ((uVar1 >> 0xc & 1) == 0) {
LAB_00108fd9:
      if ((uVar1 >> 10 & 1) != 0) {
        *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 8;
        poVar10 = std::operator<<(os,0x30);
        *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) =
             *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        std::operator<<(poVar10,": ");
      }
      if ((uVar1 >> 0xb & 1) == 0) {
        output_hex(os,curline.first,curline.second,filler,uVar1 & 0x4a,
                   (bool)((byte)(uVar1 >> 9) & 1),(bool)((byte)(uVar1 >> 0xe) & 1));
        if ((unitsperline != 0) && (lVar11 = (long)puVar12 - (long)first >> 1, lVar11 != lVar9)) {
          output_padding(os,unitsperline - (int)lVar11,filler);
        }
        if (uVar5 != 0x20) {
          std::operator<<(os,"  ");
          goto LAB_001090b0;
        }
LAB_001090a7:
        if (unitsperline == 0) goto LAB_001090f6;
      }
      else {
        if (uVar5 == 0x20) goto LAB_001090a7;
LAB_001090b0:
        output_asc(os,curline.first,curline.second);
        if (unitsperline == 0) goto LAB_001090f6;
        lVar11 = (long)puVar12 - (long)first >> 1;
        if (lVar11 != lVar9) {
          output_asc_padding(os,unitsperline - (int)lVar11);
        }
      }
      std::operator<<(os,"\n");
    }
    else {
      bVar4 = data_is_equal<std::pair<unsigned_short_const*,unsigned_short_const*>>
                        (&local_48,&curline);
      if (!bVar4) {
        local_48.first = curline.first;
        local_48.second = curline.second;
        goto LAB_00108fd9;
      }
      iVar6 = count_identical_lines(first,this->_last,unitsperline);
      local_58 = (int)uVar8;
      if (iVar6 <= local_58) goto LAB_00108fd9;
      poVar10 = std::operator<<(os,"* [ 0x");
      *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) =
           *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar6);
      std::operator<<(poVar10," lines ]\n");
      puVar12 = first + iVar6 * unitsperline;
    }
LAB_001090f6:
    puVar2 = first + uVar7;
    first = puVar12;
    if (uVar7 != 0) {
      first = puVar2;
    }
  } while( true );
}

Assistant:

void dump(std::ostream& os) const
    {
        // make copy of current 'os' settings
        char filler = os.fill();  // what to output between hex numbers.
        int unitsperline = os.width();  // when not set: everything on one line
        // upl == 0 -> everything on one line
        // upl ==-1 -> unspecified -> use defaults
        //int unitwidth = os.precision(); // NOT USED (yet)
        int adjust = os.flags() & os.adjustfield;
        int numberbase = os.flags() & os.basefield;

        bool showbase = os.flags() & os.showbase;
        bool showpos = os.flags() & os.showpos;
        bool showoffset = os.flags() & os.showpoint;
        bool uppercasehex = os.flags() & os.uppercase;
        bool summarize = os.flags() & os.skipws;

        uint64_t ofs = showoffset ? getbaseofs(os) : 0;
        uint64_t step = getstep(os);

        int threshold = getthreshold(os);

        // showpos adjust
        //   yes     left    %+-b     ...    invalid
        //   yes     right   %+b     asc only
        //   no      left    %-b     hex only
        //   no      right   %b      hex + asc

        if (unitsperline==-1) {
            if (adjust == os.left)
                unitsperline = 32 / sizeof(T);
            else if (showpos)
                unitsperline = 64 / sizeof(T);
            else
                unitsperline = 16 / sizeof(T);
        }

        auto p = _first;

        //auto prevp = p;
        auto prevline = std::make_pair(p, p);

        os << std::right;
        os.width(0);
        while (p < _last) {
            auto pend = unitsperline ? std::min(_last, p+unitsperline) : _last;
            auto curline = std::make_pair(p, pend);
            if (summarize) {
                if (data_is_equal(prevline, curline)) {
                    int count = count_identical_lines(p, _last, unitsperline);
                    if (count > threshold) {
                        os << "* [ 0x" << std::hex << count << " lines ]\n";
                        pend = p + count * unitsperline;

                        goto next;
                    }
                }
                else {
                    prevline = curline;
                }
            }

            if (showoffset)
                os << std::setw(8) << std::setfill('0') << std::hex << ofs << ": ";
            if (!showpos) {
                output_hex(os, curline.first, curline.second, filler, numberbase, showbase, uppercasehex);
                if (unitsperline && pend-p != unitsperline)
                    output_padding(os, unitsperline-(pend-p), filler);
            }

            if (!showpos && adjust != os.left)
                os << "  ";   // separate left from right
            if (adjust != os.left)
            {
                output_asc(os, curline.first, curline.second);
                if (unitsperline && pend-p != unitsperline)
                    output_asc_padding(os, unitsperline-(pend-p));
            }

            if (unitsperline)
                os << "\n";

        next:
            if (step) {
                ofs += step;
                p += step;
            }
            else {
                ofs += sizeof(T) * (pend-p);
                p = pend;
            }
        }
        clearflags(os);
    }